

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstractscrollarea.cpp
# Opt level: O0

void __thiscall
QtMWidgets::AbstractScrollAreaPrivate::animateHiddingBlurEffect(AbstractScrollAreaPrivate *this)

{
  QVariantAnimation *pQVar1;
  QVariant local_a0;
  QVariant local_80;
  QVariant local_60;
  QVariant local_30;
  AbstractScrollAreaPrivate *local_10;
  AbstractScrollAreaPrivate *this_local;
  
  pQVar1 = this->horBlurAnim;
  local_10 = this;
  QVariant::QVariant(&local_30,this->horBlur->pressure);
  QVariantAnimation::setStartValue((QVariant *)pQVar1);
  QVariant::~QVariant(&local_30);
  pQVar1 = this->horBlurAnim;
  QVariant::QVariant(&local_60,0);
  QVariantAnimation::setEndValue((QVariant *)pQVar1);
  QVariant::~QVariant(&local_60);
  pQVar1 = this->vertBlurAnim;
  QVariant::QVariant(&local_80,this->vertBlur->pressure);
  QVariantAnimation::setStartValue((QVariant *)pQVar1);
  QVariant::~QVariant(&local_80);
  pQVar1 = this->vertBlurAnim;
  QVariant::QVariant(&local_a0,0);
  QVariantAnimation::setEndValue((QVariant *)pQVar1);
  QVariant::~QVariant(&local_a0);
  if (this->horBlur->pressure != 0) {
    QAbstractAnimation::start(this->horBlurAnim,0);
  }
  if (this->vertBlur->pressure != 0) {
    QAbstractAnimation::start(this->vertBlurAnim,0);
  }
  return;
}

Assistant:

void
AbstractScrollAreaPrivate::animateHiddingBlurEffect()
{
	horBlurAnim->setStartValue( horBlur->pressure );
	horBlurAnim->setEndValue( 0 );
	vertBlurAnim->setStartValue( vertBlur->pressure );
	vertBlurAnim->setEndValue( 0 );

	if( horBlur->pressure != 0 )
		horBlurAnim->start();

	if( vertBlur->pressure != 0 )
		vertBlurAnim->start();
}